

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

bool __thiscall
QOpenGLShaderProgram::addShaderFromSourceFile
          (QOpenGLShaderProgram *this,ShaderType type,QString *fileName)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QArrayData *pQVar6;
  bool bVar7;
  int iVar8;
  QOpenGLShader *this_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QOpenGLShader *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  iVar8 = init(this,(EVP_PKEY_CTX *)
                    CONCAT44(in_register_00000034,
                             type.super_QFlagsStorageHelper<QOpenGLShader::ShaderTypeBit,_4>.
                             super_QFlagsStorage<QOpenGLShader::ShaderTypeBit>.i));
  if ((char)iVar8 != '\0') {
    this_00 = (QOpenGLShader *)operator_new(0x10);
    QOpenGLShader::QOpenGLShader(this_00,type,&this->super_QObject);
    bVar7 = QOpenGLShader::compileSourceFile(this_00,fileName);
    if (bVar7) {
      local_38 = this_00;
      QtPrivate::QPodArrayOps<QOpenGLShader*>::emplace<QOpenGLShader*&>
                ((QPodArrayOps<QOpenGLShader*> *)(lVar1 + 0xb8),*(qsizetype *)(lVar1 + 200),
                 &local_38);
      QList<QOpenGLShader_*>::end((QList<QOpenGLShader_*> *)(lVar1 + 0xb8));
      bVar7 = addShader(this,this_00);
      goto LAB_0014d080;
    }
    lVar2 = *(long *)&this_00->field_0x8;
    piVar3 = *(int **)(lVar2 + 0x88);
    uVar4 = *(undefined8 *)(lVar2 + 0x90);
    uVar5 = *(undefined8 *)(lVar2 + 0x98);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    pQVar6 = *(QArrayData **)(lVar1 + 0x88);
    *(int **)(lVar1 + 0x88) = piVar3;
    *(undefined8 *)(lVar1 + 0x90) = uVar4;
    *(undefined8 *)(lVar1 + 0x98) = uVar5;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
  }
  bVar7 = false;
LAB_0014d080:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::addShaderFromSourceFile
    (QOpenGLShader::ShaderType type, const QString& fileName)
{
    Q_D(QOpenGLShaderProgram);
    if (!init())
        return false;
    QOpenGLShader *shader = new QOpenGLShader(type, this);
    if (!shader->compileSourceFile(fileName)) {
        d->log = shader->log();
        delete shader;
        return false;
    }
    d->anonShaders.append(shader);
    return addShader(shader);
}